

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_173::TypeRefining::run(TypeRefining *this,Module *module)

{
  StructValuesMap<wasm::LUBFinder> *combinedInfos;
  __node_base_ptr *pp_Var1;
  pointer puVar2;
  Global *pGVar3;
  pointer pHVar4;
  uintptr_t uVar5;
  Module *pMVar6;
  uintptr_t *puVar7;
  pointer puVar8;
  DataSegment *pDVar9;
  TypeRefining *pTVar10;
  bool bVar11;
  HeapTypeKind HVar12;
  Struct *pSVar13;
  StructValues<wasm::LUBFinder> *pSVar14;
  iterator iVar15;
  Type TVar16;
  Type TVar17;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar18;
  const_iterator cVar19;
  pointer pFVar20;
  pointer puVar21;
  undefined1 auVar22 [8];
  pointer pHVar23;
  ulong uVar24;
  pointer pLVar25;
  uint uVar26;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_4;
  ulong uVar27;
  pointer *ppLVar28;
  Module *pMVar29;
  uintptr_t *puVar30;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  long *plVar31;
  pointer puVar32;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  optional<wasm::HeapType> oVar33;
  undefined1 local_390 [8];
  Propagator propagator;
  ContentOracle oracle;
  Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  local_2e8;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_210;
  undefined1 auStack_1b8 [8];
  FunctionStructValuesMap<wasm::LUBFinder> functionNewInfos;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_168;
  undefined1 local_128 [8];
  FunctionStructValuesMap<wasm::LUBFinder> functionSetGetInfos;
  HeapType local_d8;
  HeapType type;
  __node_base local_c8;
  Type TStack_a8;
  Type local_a0;
  Type gufaType;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> allTypes;
  __node_base_ptr ap_Stack_68 [2];
  StructValuesMap<wasm::LUBFinder> *local_58;
  Expression *local_50;
  Module *local_48;
  TypeRefining *local_40;
  StructValuesMap<wasm::LUBFinder> *local_38;
  
  if (((module->features).features & 0x400) != 0) {
    if ((((this->super_Pass).runner)->options).closedWorld == false) {
      pp_Var1 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
      Fatal::Fatal((Fatal *)pp_Var1);
      Fatal::operator<<((Fatal *)pp_Var1,(char (*) [37])0xdc6978);
      Fatal::~Fatal((Fatal *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
    SubTypes::SubTypes((SubTypes *)local_390,module);
    local_48 = module;
    local_40 = this;
    if (this->gufa == false) {
      StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::FunctionStructValuesMap
                ((FunctionStructValuesMap<wasm::LUBFinder> *)auStack_1b8,module);
      StructUtils::FunctionStructValuesMap<wasm::LUBFinder>::FunctionStructValuesMap
                ((FunctionStructValuesMap<wasm::LUBFinder> *)local_128,module);
      pTVar10 = local_40;
      oracle.options = (PassOptions *)&oracle.locationContents._M_h._M_bucket_count;
      oracle.locationContents._M_h._M_buckets = (__buckets_ptr)0x0;
      oracle.locationContents._M_h._M_bucket_count._0_1_ = 0;
      local_2e8.replacep = (Expression **)0x0;
      local_2e8.stack.usedFixed = 0;
      local_2e8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2e8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2e8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e8.currFunction = (Function *)0x0;
      local_2e8.currModule = (Module *)0x0;
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__WalkerPass_01075ae0;
      oracle.wasm = (Module *)(local_40->super_Pass).runner;
      local_210._M_buckets = (__buckets_ptr)auStack_1b8;
      local_210._M_bucket_count = (size_type)local_128;
      WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
      ::run((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
             *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,module);
      pMVar29 = (Module *)(pTVar10->super_Pass).runner;
      if (oracle.wasm != pMVar29 && oracle.wasm != (Module *)0x0) goto LAB_00ac5140;
      puVar2 = (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      oracle.wasm = pMVar29;
      local_2e8.currModule = module;
      for (puVar21 = (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar2;
          puVar21 = puVar21 + 1) {
        pGVar3 = (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
          Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
          ::walk(&local_2e8,&pGVar3->init);
        }
      }
      ppLVar28 = (pointer *)
                 (module->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (StructValuesMap<wasm::LUBFinder> *)
                 (module->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if ((StructValuesMap<wasm::LUBFinder> *)ppLVar28 != local_38) {
        do {
          pLVar25 = *ppLVar28;
          if (pLVar25[5].lub.id != 0) {
            Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
            ::walk(&local_2e8,(Expression **)(pLVar25 + 5));
            pLVar25 = *ppLVar28;
          }
          puVar7 = (uintptr_t *)pLVar25[8].lub.id;
          for (puVar30 = (uintptr_t *)pLVar25[7].lub.id; puVar30 != puVar7; puVar30 = puVar30 + 1) {
            gufaType.id = *puVar30;
            Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
            ::walk(&local_2e8,(Expression **)&gufaType);
          }
          ppLVar28 = ppLVar28 + 1;
          module = local_48;
        } while ((StructValuesMap<wasm::LUBFinder> *)ppLVar28 != local_38);
      }
      puVar8 = (module->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar32 = (module->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar8;
          puVar32 = puVar32 + 1) {
        pDVar9 = (puVar32->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar9->offset != (Expression *)0x0) {
          Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
          ::walk(&local_2e8,&pDVar9->offset);
        }
      }
      local_2e8.currModule = (Module *)0x0;
      gufaType.id = (uintptr_t)ap_Stack_68;
      ap_Stack_68[0] = (__node_base_ptr)0x0;
      local_d8.id = (uintptr_t)&stack0xffffffffffffff58;
      type.id = 1;
      local_c8._M_nxt = (_Hash_node_base *)0x0;
      TStack_a8.id = 0;
      if (functionNewInfos.
          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
          ._M_h._M_bucket_count != 0) {
        plVar31 = (long *)functionNewInfos.
                          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                          ._M_h._M_bucket_count;
        do {
          StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                    ((StructValuesMap<wasm::LUBFinder> *)(plVar31 + 2),
                     (StructValuesMap<wasm::LUBFinder> *)&gufaType);
          plVar31 = (long *)*plVar31;
        } while (plVar31 != (long *)0x0);
      }
      if (functionSetGetInfos.
          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
          ._M_h._M_bucket_count != 0) {
        plVar31 = (long *)functionSetGetInfos.
                          super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                          ._M_h._M_bucket_count;
        do {
          StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                    ((StructValuesMap<wasm::LUBFinder> *)(plVar31 + 2),
                     (StructValuesMap<wasm::LUBFinder> *)&stack0xffffffffffffff28);
          plVar31 = (long *)*plVar31;
        } while (plVar31 != (long *)0x0);
      }
      StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagate
                ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_390,
                 (StructValuesMap<wasm::LUBFinder> *)&gufaType,false,true);
      StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagate
                ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_390,
                 (StructValuesMap<wasm::LUBFinder> *)&stack0xffffffffffffff28,true,true);
      combinedInfos = &local_40->finalInfos;
      StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                ((StructValuesMap<wasm::LUBFinder> *)&gufaType,combinedInfos);
      StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
                ((StructValuesMap<wasm::LUBFinder> *)&stack0xffffffffffffff28,combinedInfos);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&stack0xffffffffffffff28);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&gufaType);
      if (local_2e8.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e8.stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e8.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e8.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Pass::~Pass((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_128);
      std::
      _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)auStack_1b8);
    }
    else {
      ContentOracle::ContentOracle
                ((ContentOracle *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,module,
                 &((this->super_Pass).runner)->options);
      wasm::ModuleUtils::collectHeapTypes
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gufaType,module);
      local_50 = (Expression *)
                 allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if ((pointer)gufaType.id !=
          allTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_58 = &local_40->finalInfos;
        TVar16 = gufaType;
        do {
          local_d8.id = (uintptr_t)
                        (((StructValuesMap<wasm::LUBFinder> *)TVar16.id)->
                        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                        )._M_h._M_buckets;
          local_38 = (StructValuesMap<wasm::LUBFinder> *)TVar16.id;
          HVar12 = HeapType::getKind(&stack0xffffffffffffff28);
          if (HVar12 == Struct) {
            pSVar13 = HeapType::getStruct(&stack0xffffffffffffff28);
            pSVar14 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[](local_58,local_d8);
            if ((pSVar13->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (pSVar13->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              uVar26 = 1;
              uVar24 = 0;
              do {
                auStack_1b8 = (undefined1  [8])local_d8.id;
                functionNewInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                ._M_h._M_buckets =
                     (__buckets_ptr)
                     CONCAT44(functionNewInfos.
                              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                              ._M_h._M_buckets._4_4_,uVar26 - 1);
                functionNewInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                ._M_h._M_before_begin._M_nxt._0_1_ = 7;
                iVar15 = std::
                         _Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&oracle.options,(key_type *)auStack_1b8);
                if (iVar15.
                    super__Node_iterator_base<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  functionSetGetInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                  ._M_h._M_before_begin._M_nxt._0_1_ = 0;
                }
                else {
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                     *)local_128,
                                    (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                     *)((long)iVar15.
                                              super__Node_iterator_base<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_true>
                                              ._M_cur + 0x28));
                }
                local_a0 = PossibleContents::getType((PossibleContents *)local_128);
                std::__detail::__variant::
                _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                                     *)local_128);
                bVar11 = wasm::Type::isExact(&(pSVar13->fields).
                                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar24].type
                                            );
                if (!bVar11) {
                  local_a0 = wasm::Type::withInexactIfNoCustomDescs
                                       (&local_a0,(FeatureSet)(local_48->features).features);
                }
                TVar16 = wasm::Type::getLeastUpperBound((Type)0x1,local_a0);
                pLVar25 = (pSVar14->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>)
                          .super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(pSVar14->
                                  super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                                  super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar25 >> 3)
                    <= uVar24) goto LAB_00ac5102;
                pLVar25[uVar24].lub.id = TVar16.id;
                uVar24 = (ulong)uVar26;
                uVar26 = uVar26 + 1;
              } while (uVar24 < (ulong)((long)(pSVar13->fields).
                                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pSVar13->fields).
                                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
          }
          TVar16.id = (uintptr_t)
                      &(local_38->
                       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                       )._M_h._M_bucket_count;
        } while ((Expression *)TVar16.id != local_50);
      }
      puVar21 = (local_48->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (local_48->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      module = local_48;
      if (puVar21 != puVar2) {
        functionSetGetInfos.
        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
        ._M_h._M_single_bucket = (__node_base_ptr)&local_40->finalInfos;
        do {
          pGVar3 = (puVar21->_M_t).
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
          if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
            FindAll<wasm::StructNew>::FindAll((FindAll<wasm::StructNew> *)auStack_1b8,pGVar3->init);
            local_58 = (StructValuesMap<wasm::LUBFinder> *)
                       functionNewInfos.
                       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                       ._M_h._M_buckets;
            auVar22 = auStack_1b8;
            if (auStack_1b8 !=
                (undefined1  [8])
                functionNewInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                ._M_h._M_buckets) {
              do {
                TVar16.id = *(uintptr_t *)auVar22;
                if (*(long *)(TVar16.id + 0x18) != 0) {
                  local_128 = (undefined1  [8])wasm::Type::getHeapType((Type *)(TVar16.id + 8));
                  local_38 = (StructValuesMap<wasm::LUBFinder> *)
                             StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                       ((StructValuesMap<wasm::LUBFinder> *)
                                        functionSetGetInfos.
                                        super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                                        ._M_h._M_single_bucket,(HeapType)local_128);
                  local_50 = (Expression *)auVar22;
                  pSVar13 = HeapType::getStruct((HeapType *)local_128);
                  auVar22 = (undefined1  [8])local_50;
                  module = local_48;
                  if ((pSVar13->fields).
                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      (pSVar13->fields).
                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    uVar26 = 1;
                    uVar24 = 0;
                    do {
                      if (*(ulong *)(TVar16.id + 0x18) <= uVar24) {
                        __assert_fail("index < usedElements",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                      ,0xbc,
                                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                     );
                      }
                      pLVar25 = (((_Vector_impl *)
                                 &(local_38->
                                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                                  )._M_h._M_buckets)->super__Vector_impl_data)._M_start;
                      if ((ulong)((long)(local_38->
                                        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                                        )._M_h._M_bucket_count - (long)pLVar25 >> 3) <= uVar24)
                      goto LAB_00ac5102;
                      TVar17 = wasm::Type::getLeastUpperBound
                                         (pLVar25[uVar24].lub.id,
                                          *(uintptr_t *)
                                           (*(long *)(*(long *)(TVar16.id + 0x10) + uVar24 * 8) + 8)
                                         );
                      pLVar25[uVar24].lub = (Type)TVar17.id;
                      uVar24 = (ulong)uVar26;
                      uVar26 = uVar26 + 1;
                      auVar22 = (undefined1  [8])local_50;
                      module = local_48;
                    } while (uVar24 < (ulong)((long)(pSVar13->fields).
                                                                                                        
                                                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(pSVar13->fields).
                                                                                                        
                                                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4));
                  }
                }
                auVar22 = (undefined1  [8])&((Expression *)auVar22)->type;
              } while (auVar22 != (undefined1  [8])local_58);
            }
            if (auStack_1b8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_1b8,
                              functionNewInfos.
                              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                              ._M_h._M_bucket_count - (long)auStack_1b8);
            }
          }
          puVar21 = puVar21 + 1;
        } while (puVar21 != puVar2);
      }
      StructUtils::TypeHierarchyPropagator<wasm::LUBFinder>::propagate
                ((TypeHierarchyPropagator<wasm::LUBFinder> *)local_390,&local_40->finalInfos,false,
                 true);
      if (gufaType.id != 0) {
        operator_delete((void *)gufaType.id,
                        (long)allTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - gufaType.id);
      }
      std::
      _Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&oracle.options);
    }
    wasm::ModuleUtils::getPublicHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&stack0xffffffffffffff28,
               module);
    std::
    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
              ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_128,local_d8.id,type.id,0,
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,auStack_1b8,&gufaType);
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_element_count = 0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_rehash_policy._4_4_ = 0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_bucket_count = 0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    auStack_1b8 = (undefined1  [8])0x0;
    functionNewInfos.
    super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
    ._M_h._M_buckets = (__buckets_ptr)0x0;
    std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_initialize_map
              ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_1b8,0);
    local_168._M_buckets = &local_168._M_single_bucket;
    local_168._M_bucket_count = 1;
    local_168._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_168._M_element_count = 0;
    local_168._M_rehash_policy._M_max_load_factor = 1.0;
    local_168._M_rehash_policy._M_next_resize = 0;
    local_168._M_single_bucket = (__node_base_ptr)0x0;
    if (local_390 !=
        (undefined1  [8])
        propagator.subTypes.types.
        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pp_Var1 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
      auVar22 = local_390;
      do {
        propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
             (__node_base_ptr)((pointer)auVar22)->id;
        HVar12 = HeapType::getKind((HeapType *)pp_Var1);
        if ((HVar12 == Struct) &&
           (oVar33 = HeapType::getDeclaredSuperType((HeapType *)pp_Var1),
           ((undefined1  [16])
            oVar33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
           (undefined1  [16])0x0)) {
          UniqueDeferredQueue<wasm::HeapType>::push
                    ((UniqueDeferredQueue<wasm::HeapType> *)auStack_1b8,
                     (HeapType)propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
        }
        auVar22 = (undefined1  [8])((long)auVar22 + 8);
      } while (auVar22 !=
               (undefined1  [8])
               propagator.subTypes.types.
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start);
    }
    local_38 = &local_40->finalInfos;
    local_50 = (Expression *)0x0;
    while (pTVar10 = local_40, pMVar29 = local_48,
          ((long)(functionNewInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                  ._M_h._M_element_count -
                 functionNewInfos.
                 super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                 ._M_h._M_bucket_count) >> 3) +
          ((long)(functionNewInfos.
                  super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                  ._M_h._M_rehash_policy._M_next_resize -
                 (long)functionNewInfos.
                       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                       ._M_h._M_single_bucket) >> 3) +
          ((ulong)-functionNewInfos.
                   super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::LUBFinder>_>_>_>
                   ._M_h._M_rehash_policy._0_8_ >> 3) * 0x40 != 0) {
      gufaType.id = (uintptr_t)
                    UniqueDeferredQueue<wasm::HeapType>::pop
                              ((UniqueDeferredQueue<wasm::HeapType> *)auStack_1b8);
      pvVar18 = SubTypes::getImmediateSubTypes((SubTypes *)local_390,(HeapType)gufaType.id);
      pHVar4 = (pvVar18->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pHVar23 = (pvVar18->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                     _M_impl.super__Vector_impl_data._M_start; pHVar23 != pHVar4;
          pHVar23 = pHVar23 + 1) {
        UniqueDeferredQueue<wasm::HeapType>::push
                  ((UniqueDeferredQueue<wasm::HeapType> *)auStack_1b8,(HeapType)pHVar23->id);
      }
      cVar19 = std::
               _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_128,(key_type *)&gufaType);
      if (cVar19.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
        pSVar13 = HeapType::getStruct((HeapType *)&gufaType);
        pFVar20 = (pSVar13->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pSVar13->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_finish != pFVar20) {
          uVar24 = 0;
          uVar27 = 1;
          do {
            TVar16.id = pFVar20[uVar24].type.id;
            pSVar14 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                (local_38,(HeapType)gufaType.id);
            pLVar25 = (pSVar14->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                      super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((ulong)((long)(pSVar14->
                              super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                              super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pLVar25 >> 3) <=
                uVar24) goto LAB_00ac5102;
            if (pLVar25[uVar24].lub.id == 1) {
              TVar16 = wasm::Type::getLeastUpperBound((Type)0x1,TVar16);
              pLVar25[uVar24].lub.id = TVar16.id;
            }
            pFVar20 = (pSVar13->fields).
                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_start;
            bVar11 = uVar27 < (ulong)((long)(pSVar13->fields).
                                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pFVar20 >> 4);
            uVar24 = uVar27;
            uVar27 = (ulong)((int)uVar27 + 1);
          } while (bVar11);
        }
        oVar33 = HeapType::getDeclaredSuperType((HeapType *)&gufaType);
        propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
             oVar33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
        oracle.wasm = (Module *)
                      CONCAT71(oracle.wasm._1_7_,
                               oVar33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._M_engaged);
        if ((((undefined1  [16])
              oVar33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
             (undefined1  [16])0x0) &&
           (local_58 = (StructValuesMap<wasm::LUBFinder> *)
                       HeapType::getStruct((HeapType *)
                                           &propagator.subTypes.typeSubTypes._M_h._M_single_bucket),
           (pointer)(local_58->
                    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                    )._M_h._M_bucket_count !=
           (((_Vector_impl *)
            &(local_58->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
             )._M_h._M_buckets)->super__Vector_impl_data)._M_start)) {
          uVar24 = 0;
          uVar27 = 1;
          do {
            cVar19 = std::
                     _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_128,
                            (key_type *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
            if (cVar19.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0)
            {
              pSVar14 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                  (local_38,(HeapType)
                                            propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
              pLVar25 = (pSVar14->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                        super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(pSVar14->
                                super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                                super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar25 >> 3) <=
                  uVar24) goto LAB_00ac5102;
              pFVar20 = (pointer)(pLVar25 + uVar24);
            }
            else {
              pFVar20 = (((_Vector_impl *)
                         &(local_58->
                          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                          )._M_h._M_buckets)->super__Vector_impl_data)._M_start + uVar24;
            }
            TVar16.id = (pFVar20->type).id;
            pSVar14 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                (local_38,(HeapType)gufaType.id);
            pLVar25 = (pSVar14->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                      super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((ulong)((long)(pSVar14->
                              super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                              super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pLVar25 >> 3) <=
                uVar24) goto LAB_00ac5102;
            bVar11 = wasm::Type::isSubType((Type)pLVar25[uVar24].lub.id,TVar16);
            if (bVar11) {
              if ((pSVar13->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar24].mutable_ == Mutable) {
                TVar16 = wasm::Type::getLeastUpperBound((Type)0x1,TVar16);
                goto LAB_00ac4c0b;
              }
            }
            else {
              TVar16 = wasm::Type::getLeastUpperBound((Type)0x1,TVar16);
LAB_00ac4c0b:
              pLVar25[uVar24].lub.id = TVar16.id;
            }
            bVar11 = uVar27 < (ulong)((long)(local_58->
                                            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                                            )._M_h._M_bucket_count -
                                      (long)(((_Vector_impl *)
                                             &(local_58->
                                              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
                                              )._M_h._M_buckets)->super__Vector_impl_data)._M_start
                                     >> 4);
            uVar24 = uVar27;
            uVar27 = (ulong)((int)uVar27 + 1);
          } while (bVar11);
        }
        pFVar20 = (pSVar13->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pSVar13->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_finish != pFVar20) {
          uVar26 = 1;
          uVar24 = 0;
          do {
            uVar5 = pFVar20[uVar24].type.id;
            pSVar14 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                                (local_38,(HeapType)gufaType.id);
            pLVar25 = (pSVar14->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                      super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((ulong)((long)(pSVar14->
                              super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                              super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pLVar25 >> 3) <=
                uVar24) {
LAB_00ac5102:
              __assert_fail("index < this->size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                            ,0x27,
                            "T &wasm::StructUtils::StructValues<wasm::LUBFinder>::operator[](size_t) [T = wasm::LUBFinder]"
                           );
            }
            local_50 = (Expression *)
                       CONCAT71((int7)((ulong)local_50 >> 8),
                                (byte)local_50 | pLVar25[uVar24].lub.id != uVar5);
            uVar24 = (ulong)uVar26;
            pFVar20 = (pSVar13->fields).
                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar26 = uVar26 + 1;
          } while (uVar24 < (ulong)((long)(pSVar13->fields).
                                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar20
                                   >> 4));
        }
      }
    }
    if (((ulong)local_50 & 1) != 0) {
      oracle.options = (PassOptions *)&oracle.locationContents._M_h._M_bucket_count;
      oracle.locationContents._M_h._M_buckets = (__buckets_ptr)0x0;
      oracle.locationContents._M_h._M_bucket_count._0_1_ = 0;
      local_2e8.replacep = (Expression **)0x0;
      local_2e8.stack.usedFixed = 0;
      local_2e8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2e8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2e8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e8.currFunction = (Function *)0x0;
      local_2e8.currModule = (Module *)0x0;
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__WalkerPass_01075b40;
      local_210._M_buckets = (__buckets_ptr)local_40;
      oracle.wasm = (Module *)(local_40->super_Pass).runner;
      WalkerPass<wasm::PostWalker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>_>::run
                ((WalkerPass<wasm::PostWalker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>_> *)
                 &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,local_48);
      pMVar6 = (Module *)(pTVar10->super_Pass).runner;
      if (oracle.wasm != pMVar6 && oracle.wasm != (Module *)0x0) {
LAB_00ac5140:
        __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                      ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
      }
      local_2e8.currModule = pMVar29;
      puVar2 = (pMVar29->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      oracle.wasm = pMVar6;
      for (puVar21 = (pMVar29->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar2;
          puVar21 = puVar21 + 1) {
        pGVar3 = (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
          Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                    ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2e8,
                     &pGVar3->init);
        }
      }
      ppLVar28 = (pointer *)
                 (local_48->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (StructValuesMap<wasm::LUBFinder> *)
                 (local_48->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if ((StructValuesMap<wasm::LUBFinder> *)ppLVar28 != local_38) {
        do {
          pLVar25 = *ppLVar28;
          if (pLVar25[5].lub.id != 0) {
            Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                      ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2e8,
                       (Expression **)(pLVar25 + 5));
            pLVar25 = *ppLVar28;
          }
          puVar7 = (uintptr_t *)pLVar25[8].lub.id;
          for (puVar30 = (uintptr_t *)pLVar25[7].lub.id; puVar30 != puVar7; puVar30 = puVar30 + 1) {
            gufaType.id = *puVar30;
            Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                      ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2e8,
                       (Expression **)&gufaType);
          }
          ppLVar28 = ppLVar28 + 1;
        } while ((StructValuesMap<wasm::LUBFinder> *)ppLVar28 != local_38);
      }
      puVar8 = (local_48->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar32 = (local_48->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar8;
          puVar32 = puVar32 + 1) {
        pDVar9 = (puVar32->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar9->offset != (Expression *)0x0) {
          Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_>::walk
                    ((Walker<ReadUpdater,_wasm::Visitor<ReadUpdater,_void>_> *)&local_2e8,
                     &pDVar9->offset);
        }
      }
      local_2e8.currModule = (Module *)0x0;
      if (local_2e8.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e8.stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e8.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e8.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Pass::~Pass((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      pMVar29 = local_48;
      GlobalTypeRewriter::GlobalTypeRewriter
                ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                 local_48);
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__GlobalTypeRewriter_01075ba0;
      local_2e8.stack.fixed._M_elems[0].func = (TaskFunc)local_40;
      gufaType.id = 0;
      GlobalTypeRewriter::update
                ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gufaType);
      if (gufaType.id != 0) {
        operator_delete((void *)gufaType.id,-gufaType.id);
      }
      GlobalTypeRewriter::~GlobalTypeRewriter
                ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      ReFinalize::ReFinalize((ReFinalize *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
             *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,(local_40->super_Pass).runner
            ,pMVar29);
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__ReFinalize_01070c30;
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_210);
      if (local_2e8.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e8.stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e8.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e8.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Pass::~Pass((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
      pTVar10 = local_40;
      oracle.options = (PassOptions *)&oracle.locationContents._M_h._M_bucket_count;
      oracle.locationContents._M_h._M_buckets = (__buckets_ptr)0x0;
      oracle.locationContents._M_h._M_bucket_count._0_1_ = 0;
      local_2e8.replacep = (Expression **)0x0;
      local_2e8.stack.usedFixed = 0;
      local_2e8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2e8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2e8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e8.currFunction = (Function *)0x0;
      local_2e8.currModule = (Module *)0x0;
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
           (__node_base_ptr)&PTR__WalkerPass_01075bf0;
      oracle.wasm = (Module *)(local_40->super_Pass).runner;
      WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_>::run
                ((WalkerPass<wasm::PostWalker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>_> *)
                 &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,pMVar29);
      pMVar6 = (Module *)(pTVar10->super_Pass).runner;
      if (oracle.wasm != pMVar6 && oracle.wasm != (Module *)0x0) goto LAB_00ac5140;
      local_2e8.currModule = pMVar29;
      puVar2 = (pMVar29->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      oracle.wasm = pMVar6;
      for (puVar21 = (pMVar29->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar2;
          puVar21 = puVar21 + 1) {
        pGVar3 = (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
          Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                    ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2e8,
                     &pGVar3->init);
        }
      }
      ppLVar28 = (pointer *)
                 (pMVar29->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (StructValuesMap<wasm::LUBFinder> *)
                 (pMVar29->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if ((StructValuesMap<wasm::LUBFinder> *)ppLVar28 != local_38) {
        do {
          pLVar25 = *ppLVar28;
          if (pLVar25[5].lub.id != 0) {
            Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                      ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2e8,
                       (Expression **)(pLVar25 + 5));
            pLVar25 = *ppLVar28;
          }
          puVar7 = (uintptr_t *)pLVar25[8].lub.id;
          for (puVar30 = (uintptr_t *)pLVar25[7].lub.id; puVar30 != puVar7; puVar30 = puVar30 + 1) {
            gufaType.id = *puVar30;
            Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                      ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2e8,
                       (Expression **)&gufaType);
          }
          ppLVar28 = ppLVar28 + 1;
          pMVar29 = local_48;
        } while ((StructValuesMap<wasm::LUBFinder> *)ppLVar28 != local_38);
      }
      puVar8 = (pMVar29->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar32 = (pMVar29->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar32 != puVar8;
          puVar32 = puVar32 + 1) {
        pDVar9 = (puVar32->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar9->offset != (Expression *)0x0) {
          Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_>::walk
                    ((Walker<WriteUpdater,_wasm::Visitor<WriteUpdater,_void>_> *)&local_2e8,
                     &pDVar9->offset);
        }
      }
      local_2e8.currModule = (Module *)0x0;
      if (local_2e8.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2e8.stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2e8.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2e8.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Pass::~Pass((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_168);
    std::_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Deque_base
              ((_Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_1b8);
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_128);
    if ((Type *)local_d8.id != (Type *)0x0) {
      operator_delete((void *)local_d8.id,(long)local_c8._M_nxt - local_d8.id);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&propagator.subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    if (local_390 != (undefined1  [8])0x0) {
      operator_delete((void *)local_390,
                      (long)propagator.subTypes.types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_390);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "TypeRefining requires --closed-world";
    }

    Propagator propagator(*module);

    // Compute our main data structure, finalInfos, either normally or using
    // GUFA.
    if (!gufa) {
      computeFinalInfos(module, propagator);
    } else {
      computeFinalInfosGUFA(module, propagator);
    }

    useFinalInfos(module, propagator);
  }